

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlibemu_opl_inc.c
# Opt level: O0

void adlib_OPL3_reset(void *chip)

{
  long lVar1;
  op_type_conflict *op;
  Bits i;
  OPL_DATA_conflict *OPL;
  void *chip_local;
  
  memset((void *)((long)chip + 0x1b2c),0,0x200);
  memset((void *)((long)chip + 8),0,0x1b00);
  memset((void *)((long)chip + 0x1d2c),0,0x2c);
  for (op._4_4_ = 0; op._4_4_ < 0x24; op._4_4_ = op._4_4_ + 1) {
    lVar1 = (long)op._4_4_ * 0xc0;
    *(undefined4 *)((long)chip + lVar1 + 0x78) = 5;
    *(undefined4 *)((long)chip + lVar1 + 0x94) = 0;
    *(undefined8 *)((long)chip + lVar1 + 0x20) = 0;
    *(undefined8 *)((long)chip + lVar1 + 0x28) = 0;
    *(undefined8 *)((long)chip + lVar1 + 0x30) = 0;
    *(undefined4 *)((long)chip + lVar1 + 0x10) = 0;
    *(undefined4 *)((long)chip + lVar1 + 0x18) = 0;
    *(undefined4 *)((long)chip + lVar1 + 0x7c) = 0;
    *(Bit32u *)((long)chip + lVar1 + 0x90) = wavemask[0];
    *(Bit16s **)((long)chip + lVar1 + 0x88) = wavtable + waveform[0];
    *(undefined4 *)((long)chip + lVar1 + 0x80) = 0;
    *(undefined4 *)((long)chip + lVar1 + 0x9c) = 0;
    *(undefined4 *)((long)chip + lVar1 + 0xa0) = 0;
    *(undefined4 *)((long)chip + lVar1 + 0xa4) = 0;
    *(undefined4 *)((long)chip + lVar1 + 0xa8) = 0;
    *(undefined4 *)((long)chip + lVar1 + 0xac) = 0;
    *(undefined1 *)((long)chip + lVar1 + 0xb0) = 0;
    *(undefined4 *)((long)chip + lVar1 + 0xb4) = 0;
    *(undefined1 *)((long)chip + lVar1 + 0xb8) = 0;
    *(undefined1 *)((long)chip + lVar1 + 0xb9) = 0;
    *(undefined4 *)((long)chip + lVar1 + 0xbc) = 1;
    *(undefined4 *)((long)chip + lVar1 + 0xc0) = 1;
  }
  *(undefined1 *)((long)chip + 0x1b29) = 0;
  *(undefined2 *)((long)chip + 0x1b2a) = 0;
  *(undefined1 *)((long)chip + 0x1b28) = 1;
  return;
}

Assistant:

void ADLIBEMU(reset)(void *chip)
{
	OPL_DATA* OPL = (OPL_DATA*)chip;
	Bits i;
	op_type* op;
	
	memset(OPL->adlibreg, 0x00, sizeof(OPL->adlibreg));
	memset(OPL->op, 0x00, sizeof(op_type) * MAXOPERATORS);
	memset(OPL->wave_sel, 0x00, sizeof(OPL->wave_sel));
	
	for (i=0;i<MAXOPERATORS;i++)
	{
		op = &OPL->op[i];
		
		op->op_state = OF_TYPE_OFF;
		op->act_state = OP_ACT_OFF;
		op->amp = 0.0;
		op->step_amp = 0.0;
		op->vol = 0.0;
		op->tcount = 0;
		op->tinc = 0;
		op->toff = 0;
		op->cur_wmask = wavemask[0];
		op->cur_wform = &wavtable[waveform[0]];
		op->freq_high = 0;

		op->generator_pos = 0;
		op->cur_env_step = 0;
		op->env_step_a = 0;
		op->env_step_d = 0;
		op->env_step_r = 0;
		op->step_skip_pos_a = 0;
		op->env_step_skip_a = 0;

#if defined(OPLTYPE_IS_OPL3)
		op->is_4op = false;
		op->is_4op_attached = false;
		op->left_pan = 1;
		op->right_pan = 1;
#endif
	}
	
	OPL->status = 0;
	OPL->opl_addr = 0;
	OPL->isDisabled = 0x01;	// OPL4 speed hack
	
	return;
}